

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_fd_generic_configsocket.c
# Opt level: O1

int os_fd_generic_configsocket
              (os_fd *sock,netaddr_socket *bind_to,size_t recvbuf,_Bool rawip,os_interface *os_if,
              oonf_log_source log_src)

{
  ulong uVar1;
  int iVar2;
  char *pcVar3;
  int *piVar4;
  char *pcVar5;
  size_t sVar6;
  long lVar7;
  undefined8 uVar8;
  netaddr_socket *pnVar9;
  netaddr_socket *pnVar10;
  char *pcVar11;
  size_t recvbuf_local;
  int value;
  netaddr_str buf;
  netaddr_socket bindto;
  
  uVar1 = (ulong)log_src;
  pnVar9 = bind_to;
  pnVar10 = &bindto;
  for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
    *(undefined8 *)pnVar10 = *(undefined8 *)pnVar9;
    pnVar9 = (netaddr_socket *)(pnVar9->v4).sin_zero;
    pnVar10 = (netaddr_socket *)(pnVar10->v4).sin_zero;
  }
  recvbuf_local = recvbuf;
  iVar2 = os_fd_generic_set_nonblocking(sock);
  if (iVar2 == 0) {
    if ((!rawip) && ((bind_to->v4).sin_family == 10)) {
      value = 1;
      iVar2 = setsockopt(sock->fd,0x29,0x1a,&value,4);
      if ((iVar2 < 0) && (((&log_global_mask)[uVar1] & 4) != 0)) {
        piVar4 = __errno_location();
        pcVar3 = strerror(*piVar4);
        oonf_log(4,uVar1,"src/base/os_generic/os_fd_generic_configsocket.c",0x5a,0,0,
                 "Could not force socket to IPv6 only, continue: %s (%d)\n",pcVar3,*piVar4);
      }
    }
    if ((os_if != (os_interface *)0x0) && ((os_if->flags).any == false)) {
      iVar2 = sock->fd;
      pcVar3 = os_if->name;
      sVar6 = strlen(pcVar3);
      iVar2 = setsockopt(iVar2,1,0x19,pcVar3,(int)sVar6 + 1);
      if (iVar2 < 0) {
        if (((&log_global_mask)[uVar1] & 4) == 0) {
          return -1;
        }
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        iVar2 = *piVar4;
        uVar8 = 99;
        pcVar11 = "Cannot bind socket to interface %s: %s (%d)\n";
        goto LAB_001012c2;
      }
    }
    value = 1;
    iVar2 = setsockopt(sock->fd,1,2,&value,4);
    if (iVar2 < 0) {
      if (((&log_global_mask)[uVar1] & 4) == 0) {
        return -1;
      }
      pcVar3 = (char *)netaddr_socket_to_string(&buf,&bindto);
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      iVar2 = *piVar4;
      pcVar11 = "Cannot reuse address for %s: %s (%d)\n";
      uVar8 = 0x6d;
    }
    else {
      if (recvbuf_local != 0) {
        if (0x2000 < recvbuf_local) {
          do {
            iVar2 = setsockopt(sock->fd,1,8,&recvbuf_local,8);
            if (iVar2 == 0) break;
            recvbuf_local = recvbuf_local - 0x400;
          } while (0x2000 < recvbuf_local);
        }
        if (recvbuf_local < 0x2000) {
          if (((&log_global_mask)[uVar1] & 4) == 0) {
            return -1;
          }
          pcVar3 = (char *)netaddr_socket_to_string(&buf,&bindto);
          piVar4 = __errno_location();
          pcVar5 = strerror(*piVar4);
          iVar2 = *piVar4;
          pcVar11 = "Cannot setup receive buffer size for %s: %s (%d)\n";
          uVar8 = 0x86;
          goto LAB_001012c2;
        }
      }
      if ((os_if != (os_interface *)0x0) && (bindto.v4.sin_family == 10)) {
        bindto.v6.sin6_scope_id = os_if->index;
      }
      iVar2 = bind(sock->fd,(sockaddr *)&bindto.v4,0x80);
      if (-1 < iVar2) {
        return 0;
      }
      if (((&log_global_mask)[uVar1] & 4) == 0) {
        return -1;
      }
      pcVar3 = (char *)netaddr_socket_to_string(&buf,&bindto);
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      iVar2 = *piVar4;
      pcVar11 = "Cannot bind socket to address %s: %s (%d)\n";
      uVar8 = 0x95;
    }
  }
  else {
    if (((&log_global_mask)[uVar1] & 4) == 0) {
      return -1;
    }
    pcVar3 = (char *)netaddr_socket_to_string(&buf,&bindto);
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    iVar2 = *piVar4;
    pcVar11 = "Cannot make socket non-blocking %s: %s (%d)\n";
    uVar8 = 0x52;
  }
LAB_001012c2:
  oonf_log(4,uVar1,"src/base/os_generic/os_fd_generic_configsocket.c",uVar8,0,0,pcVar11,pcVar3,
           pcVar5,iVar2);
  return -1;
}

Assistant:

int
os_fd_generic_configsocket(struct os_fd *sock, const union netaddr_socket *bind_to, size_t recvbuf, bool rawip,
  const struct os_interface *os_if, enum oonf_log_source log_src) {
  union netaddr_socket bindto;
  struct netaddr_str buf;
  socklen_t addrlen;
  int value;

  /* temporary copy bindto address */
  memcpy(&bindto, bind_to, sizeof(bindto));

  if (os_fd_set_nonblocking(sock)) {
    OONF_WARN(log_src, "Cannot make socket non-blocking %s: %s (%d)\n", netaddr_socket_to_string(&buf, &bindto),
      strerror(errno), errno);
    return -1;
  }

#if defined(IPV6_V6ONLY)
  if (!rawip && bind_to->std.sa_family == AF_INET6) {
    value = 1;
    if (setsockopt(sock->fd, IPPROTO_IPV6, IPV6_V6ONLY, (void *)&value, sizeof(value)) < 0) {
      OONF_WARN(log_src, "Could not force socket to IPv6 only, continue: %s (%d)\n", strerror(errno), errno);
    }
  }
#endif

#if defined(SO_BINDTODEVICE)
  /* this is binding the socket, not a multicast address */
  if (os_if != NULL && !os_if->flags.any &&
      setsockopt(sock->fd, SOL_SOCKET, SO_BINDTODEVICE, os_if->name, strlen(os_if->name) + 1) < 0) {
    OONF_WARN(log_src, "Cannot bind socket to interface %s: %s (%d)\n", os_if->name, strerror(errno), errno);
    return -1;
  }
#endif

#if defined(SO_REUSEADDR)
  /* allow to reuse address */
  value = 1;
  if (setsockopt(sock->fd, SOL_SOCKET, SO_REUSEADDR, &value, sizeof(value)) < 0) {
    OONF_WARN(log_src, "Cannot reuse address for %s: %s (%d)\n", netaddr_socket_to_string(&buf, &bindto),
      strerror(errno), errno);
    return -1;
  }
#endif

#if defined(IP_RECVIF)
  if (os_if != NULL && setsockopt(sock, IPPROTO_IP, IP_RECVIF, &yes, sizeof(yes)) < 0) {
    OONF_WARN(log_src, "Cannot apply IP_RECVIF for %s: %s (%d)\n", netaddr_socket_to_string(&buf, &bindto),
      strerror(errno), errno);
    return -1;
  }
#endif

#if defined(SO_RCVBUF)
  if (recvbuf > 0) {
    while (recvbuf > 8192) {
      if (setsockopt(sock->fd, SOL_SOCKET, SO_RCVBUF, (void *)&recvbuf, sizeof(recvbuf)) == 0) {
        break;
      }

      recvbuf -= 1024;
    }

    if (recvbuf < 8192) {
      OONF_WARN(log_src, "Cannot setup receive buffer size for %s: %s (%d)\n", netaddr_socket_to_string(&buf, &bindto),
        strerror(errno), errno);
      return -1;
    }
  }
#endif

  /* add ipv6 interface scope if necessary */
  if (os_if != NULL && netaddr_socket_get_addressfamily(&bindto) == AF_INET6) {
    bindto.v6.sin6_scope_id = os_if->index;
  }

  /* bind the socket to the port number */
  addrlen = sizeof(bindto);
  if (bind(sock->fd, &bindto.std, addrlen) < 0) {
    OONF_WARN(log_src, "Cannot bind socket to address %s: %s (%d)\n", netaddr_socket_to_string(&buf, &bindto),
      strerror(errno), errno);

    return -1;
  }

  return 0;
}